

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O0

void __thiscall CEditor::DoQuadEnvPoint(CEditor *this,CQuad *pQuad,int QIndex,int PIndex)

{
  CEnvelope *pCVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  CUI *pCVar7;
  CEnvelope **ppCVar8;
  CEnvPoint *pCVar9;
  CEnvPoint *pCVar10;
  IInput *pIVar11;
  IGraphics *pIVar12;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  CEditor *in_RDI;
  long in_FS_OFFSET;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float y;
  float x;
  int LineDistance;
  bool IgnoreGrid;
  float dy;
  float dx;
  float CenterY;
  float CenterX;
  void *pID;
  CEnvelope *pEnvelope;
  float wy;
  float wx;
  CQuadItem QuadItem;
  float local_68;
  float local_64;
  CQuadItem local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar7 = UI(in_RDI);
  fVar13 = CUI::MouseWorldX(pCVar7);
  pCVar7 = UI(in_RDI);
  fVar14 = CUI::MouseWorldY(pCVar7);
  ppCVar8 = array<CEnvelope_*,_allocator_default<CEnvelope_*>_>::operator[]
                      (&(in_RDI->m_Map).m_lEnvelopes,*(int *)(in_RSI + 0x88));
  pCVar1 = *ppCVar8;
  pCVar9 = array<CEnvPoint,_allocator_default<CEnvPoint>_>::operator[](&pCVar1->m_lPoints,in_ECX);
  fVar15 = fx2f(*(int *)(in_RSI + 0x20));
  pCVar10 = array<CEnvPoint,_allocator_default<CEnvPoint>_>::operator[](&pCVar1->m_lPoints,in_ECX);
  fVar16 = fx2f((pCVar10->super_CEnvPoint_v1).m_aValues[0]);
  fVar17 = fx2f(*(int *)(in_RSI + 0x24));
  pCVar10 = array<CEnvPoint,_allocator_default<CEnvPoint>_>::operator[](&pCVar1->m_lPoints,in_ECX);
  fVar18 = fx2f((pCVar10->super_CEnvPoint_v1).m_aValues[1]);
  fVar19 = ((fVar15 + fVar16) - fVar13) / in_RDI->m_WorldZoom;
  fVar20 = ((fVar17 + fVar18) - fVar14) / in_RDI->m_WorldZoom;
  if (fVar19 * fVar19 + fVar20 * fVar20 < 50.0) {
    pCVar7 = UI(in_RDI);
    bVar2 = CUI::CheckActiveItem(pCVar7,(void *)0x0);
    if (bVar2) {
      pCVar7 = UI(in_RDI);
      CUI::SetHotItem(pCVar7,pCVar9);
      DoQuadEnvPoint::s_ActQIndex = in_EDX;
    }
  }
  pIVar11 = Input(in_RDI);
  uVar4 = (*(pIVar11->super_IInterface)._vptr_IInterface[4])(pIVar11,0x162);
  if ((uVar4 & 1) == 0) {
    pIVar11 = Input(in_RDI);
    uVar4 = (*(pIVar11->super_IInterface)._vptr_IInterface[4])(pIVar11,0x166);
    if ((uVar4 & 1) != 0) goto LAB_001f149f;
    bVar2 = false;
  }
  else {
LAB_001f149f:
    bVar2 = true;
  }
  pCVar7 = UI(in_RDI);
  bVar3 = CUI::CheckActiveItem(pCVar7,pCVar9);
  if ((bVar3) && (DoQuadEnvPoint::s_ActQIndex == in_EDX)) {
    if (DoQuadEnvPoint::s_Operation == 1) {
      if (((in_RDI->m_GridActive & 1U) == 0) || (bVar2)) {
        iVar5 = f2fx(fVar13 - DoQuadEnvPoint::s_LastWx);
        pCVar9 = array<CEnvPoint,_allocator_default<CEnvPoint>_>::operator[]
                           (&pCVar1->m_lPoints,in_ECX);
        (pCVar9->super_CEnvPoint_v1).m_aValues[0] =
             iVar5 + (pCVar9->super_CEnvPoint_v1).m_aValues[0];
        iVar5 = f2fx(fVar14 - DoQuadEnvPoint::s_LastWy);
        pCVar9 = array<CEnvPoint,_allocator_default<CEnvPoint>_>::operator[]
                           (&pCVar1->m_lPoints,in_ECX);
        (pCVar9->super_CEnvPoint_v1).m_aValues[1] =
             iVar5 + (pCVar9->super_CEnvPoint_v1).m_aValues[1];
      }
      else {
        iVar5 = GetLineDistance(in_RDI);
        if (fVar13 < 0.0) {
          iVar6 = (int)((fVar13 - (float)((iVar5 / 2) * in_RDI->m_GridFactor)) /
                       (float)(iVar5 * in_RDI->m_GridFactor)) * iVar5 * in_RDI->m_GridFactor;
        }
        else {
          iVar6 = (int)((fVar13 + (float)((iVar5 / 2) * in_RDI->m_GridFactor)) /
                       (float)(iVar5 * in_RDI->m_GridFactor)) * iVar5 * in_RDI->m_GridFactor;
        }
        local_64 = (float)iVar6;
        if (fVar14 < 0.0) {
          iVar5 = (int)((fVar14 - (float)((iVar5 / 2) * in_RDI->m_GridFactor)) /
                       (float)(iVar5 * in_RDI->m_GridFactor)) * iVar5 * in_RDI->m_GridFactor;
        }
        else {
          iVar5 = (int)((fVar14 + (float)((iVar5 / 2) * in_RDI->m_GridFactor)) /
                       (float)(iVar5 * in_RDI->m_GridFactor)) * iVar5 * in_RDI->m_GridFactor;
        }
        local_68 = (float)iVar5;
        iVar5 = f2fx(local_64);
        pCVar9 = array<CEnvPoint,_allocator_default<CEnvPoint>_>::operator[]
                           (&pCVar1->m_lPoints,in_ECX);
        (pCVar9->super_CEnvPoint_v1).m_aValues[0] = iVar5;
        iVar5 = f2fx(local_68);
        pCVar9 = array<CEnvPoint,_allocator_default<CEnvPoint>_>::operator[]
                           (&pCVar1->m_lPoints,in_ECX);
        (pCVar9->super_CEnvPoint_v1).m_aValues[1] = iVar5;
      }
    }
    else if (DoQuadEnvPoint::s_Operation == 2) {
      fVar19 = in_RDI->m_MouseDeltaX;
      pCVar9 = array<CEnvPoint,_allocator_default<CEnvPoint>_>::operator[]
                         (&pCVar1->m_lPoints,in_ECX);
      (pCVar9->super_CEnvPoint_v1).m_aValues[2] =
           (int)(fVar19 * 10.0 + (float)(pCVar9->super_CEnvPoint_v1).m_aValues[2]);
    }
    DoQuadEnvPoint::s_LastWx = fVar13;
    DoQuadEnvPoint::s_LastWy = fVar14;
    pCVar7 = UI(in_RDI);
    bVar2 = CUI::MouseButton(pCVar7,0);
    if (!bVar2) {
      in_RDI->m_LockMouse = false;
      DoQuadEnvPoint::s_Operation = 0;
      pCVar7 = UI(in_RDI);
      CUI::SetActiveItem(pCVar7,(void *)0x0);
    }
    pIVar12 = Graphics(in_RDI);
    (*(pIVar12->super_IInterface)._vptr_IInterface[0x21])(0x3f800000,0x3f800000,0x3f800000);
    goto LAB_001f19d6;
  }
  pCVar7 = UI(in_RDI);
  pCVar10 = (CEnvPoint *)CUI::HotItem(pCVar7);
  if ((pCVar10 != pCVar9) || (DoQuadEnvPoint::s_ActQIndex != in_EDX)) {
    pIVar12 = Graphics(in_RDI);
    (*(pIVar12->super_IInterface)._vptr_IInterface[0x21])(0,0x3f800000);
    goto LAB_001f19d6;
  }
  ms_pUiGotContext = pCVar9;
  pIVar12 = Graphics(in_RDI);
  (*(pIVar12->super_IInterface)._vptr_IInterface[0x21])(0x3f800000,0x3f800000,0x3f800000);
  in_RDI->m_pTooltip = "Left mouse button to move. Hold ctrl to rotate. Hold alt to ignore grid.";
  pCVar7 = UI(in_RDI);
  bVar2 = CUI::MouseButton(pCVar7,0);
  if (!bVar2) {
    in_RDI->m_SelectedEnvelopePoint = -1;
    in_RDI->m_SelectedQuadEnvelope = -1;
    goto LAB_001f19d6;
  }
  pIVar11 = Input(in_RDI);
  uVar4 = (*(pIVar11->super_IInterface)._vptr_IInterface[4])(pIVar11,0x160);
  if ((uVar4 & 1) == 0) {
    pIVar11 = Input(in_RDI);
    uVar4 = (*(pIVar11->super_IInterface)._vptr_IInterface[4])(pIVar11,0x164);
    if ((uVar4 & 1) != 0) goto LAB_001f18f1;
    DoQuadEnvPoint::s_Operation = 1;
  }
  else {
LAB_001f18f1:
    in_RDI->m_LockMouse = true;
    DoQuadEnvPoint::s_Operation = 2;
  }
  in_RDI->m_SelectedEnvelopePoint = in_ECX;
  in_RDI->m_SelectedQuadEnvelope = *(int *)(in_RSI + 0x88);
  pCVar7 = UI(in_RDI);
  CUI::SetActiveItem(pCVar7,pCVar9);
  if (in_RDI->m_SelectedQuad != in_EDX) {
    in_RDI->m_SelectedPoints = 0;
  }
  in_RDI->m_SelectedQuad = in_EDX;
  DoQuadEnvPoint::s_LastWx = fVar13;
  DoQuadEnvPoint::s_LastWy = fVar14;
LAB_001f19d6:
  fVar13 = in_RDI->m_WorldZoom * 5.0;
  IGraphics::CQuadItem::CQuadItem(&local_18,fVar15 + fVar16,fVar17 + fVar18,fVar13,fVar13);
  pIVar12 = Graphics(in_RDI);
  (*(pIVar12->super_IInterface)._vptr_IInterface[0x1c])(pIVar12,&local_18,1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CEditor::DoQuadEnvPoint(const CQuad *pQuad, int QIndex, int PIndex)
{
	enum
	{
		OP_NONE=0,
		OP_MOVE,
		OP_ROTATE,
	};

	// some basic values
	static float s_LastWx;
	static float s_LastWy;
	static int s_Operation = OP_NONE;
	float wx = UI()->MouseWorldX();
	float wy = UI()->MouseWorldY();
	CEnvelope *pEnvelope = m_Map.m_lEnvelopes[pQuad->m_PosEnv];
	void *pID = &pEnvelope->m_lPoints[PIndex];
	static int s_ActQIndex = -1;

	// get pivot
	float CenterX = fx2f(pQuad->m_aPoints[4].x)+fx2f(pEnvelope->m_lPoints[PIndex].m_aValues[0]);
	float CenterY = fx2f(pQuad->m_aPoints[4].y)+fx2f(pEnvelope->m_lPoints[PIndex].m_aValues[1]);

	float dx = (CenterX - wx)/m_WorldZoom;
	float dy = (CenterY - wy)/m_WorldZoom;
	if(dx*dx+dy*dy < 50.0f && UI()->CheckActiveItem(0))
	{
		UI()->SetHotItem(pID);
		s_ActQIndex = QIndex;
	}

	bool IgnoreGrid;
	if(Input()->KeyIsPressed(KEY_LALT) || Input()->KeyIsPressed(KEY_RALT))
		IgnoreGrid = true;
	else
		IgnoreGrid = false;

	if(UI()->CheckActiveItem(pID) && s_ActQIndex == QIndex)
	{
		if(s_Operation == OP_MOVE)
		{
			if(m_GridActive && !IgnoreGrid)
			{
				int LineDistance = GetLineDistance();

				float x = 0.0f;
				float y = 0.0f;
				if(wx >= 0)
					x = (int)((wx+(LineDistance/2)*m_GridFactor)/(LineDistance*m_GridFactor)) * (LineDistance*m_GridFactor);
				else
					x = (int)((wx-(LineDistance/2)*m_GridFactor)/(LineDistance*m_GridFactor)) * (LineDistance*m_GridFactor);
				if(wy >= 0)
					y = (int)((wy+(LineDistance/2)*m_GridFactor)/(LineDistance*m_GridFactor)) * (LineDistance*m_GridFactor);
				else
					y = (int)((wy-(LineDistance/2)*m_GridFactor)/(LineDistance*m_GridFactor)) * (LineDistance*m_GridFactor);

				pEnvelope->m_lPoints[PIndex].m_aValues[0] = f2fx(x);
				pEnvelope->m_lPoints[PIndex].m_aValues[1] = f2fx(y);
			}
			else
			{
				pEnvelope->m_lPoints[PIndex].m_aValues[0] += f2fx(wx-s_LastWx);
				pEnvelope->m_lPoints[PIndex].m_aValues[1] += f2fx(wy-s_LastWy);
			}
		}
		else if(s_Operation == OP_ROTATE)
			pEnvelope->m_lPoints[PIndex].m_aValues[2] += 10*m_MouseDeltaX;

		s_LastWx = wx;
		s_LastWy = wy;

		if(!UI()->MouseButton(0))
		{
			m_LockMouse = false;
			s_Operation = OP_NONE;
			UI()->SetActiveItem(0);
		}

		Graphics()->SetColor(1.0f, 1.0f, 1.0f, 1.0f);
	}
	else if(UI()->HotItem() == pID && s_ActQIndex == QIndex)
	{
		ms_pUiGotContext = pID;

		Graphics()->SetColor(1.0f, 1.0f, 1.0f, 1.0f);
		m_pTooltip = "Left mouse button to move. Hold ctrl to rotate. Hold alt to ignore grid.";

		if(UI()->MouseButton(0))
		{
			if(Input()->KeyIsPressed(KEY_LCTRL) || Input()->KeyIsPressed(KEY_RCTRL))
			{
				m_LockMouse = true;
				s_Operation = OP_ROTATE;
			}
			else
				s_Operation = OP_MOVE;

			m_SelectedEnvelopePoint = PIndex;
			m_SelectedQuadEnvelope = pQuad->m_PosEnv;

			UI()->SetActiveItem(pID);
			if(m_SelectedQuad != QIndex)
				m_SelectedPoints = 0;
			m_SelectedQuad = QIndex;
			s_LastWx = wx;
			s_LastWy = wy;
		}
		else
		{
			m_SelectedEnvelopePoint = -1;
			m_SelectedQuadEnvelope = -1;
		}
	}
	else
		Graphics()->SetColor(0.0f, 1.0f, 0.0f, 1.0f);

	IGraphics::CQuadItem QuadItem(CenterX, CenterY, 5.0f*m_WorldZoom, 5.0f*m_WorldZoom);
	Graphics()->QuadsDraw(&QuadItem, 1);
}